

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataView.cpp
# Opt level: O1

Var Js::DataView::EntryGetFloat32(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL isLittleEndian;
  undefined4 *puVar4;
  Var pvVar5;
  DataView *this;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != local_38._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x117,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00b46f0a;
    *puVar4 = 0;
  }
  callInfo_local = local_38;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DataView.cpp"
                                ,0x11b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00b46f0a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) != 0) {
    pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    bVar3 = VarIs<Js::DataView>(pvVar5);
    if (bVar3) {
      if (1 < (callInfo_local._0_4_ & 0xffffff)) {
        isLittleEndian = 0;
        if ((callInfo_local._0_4_ & 0xffffff) != 2) {
          pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,2);
          isLittleEndian = JavascriptConversion::ToBoolean(pvVar5,pSVar1);
        }
        pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,0);
        this = VarTo<Js::DataView>(pvVar5);
        pvVar5 = Arguments::operator[]((Arguments *)&callInfo_local,1);
        pvVar5 = GetValueWithCheck<float,float*>
                           (this,pvVar5,isLittleEndian,L"DataView.prototype.GetFloat32");
        return pvVar5;
      }
      JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec20,L"offset");
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec21,(PCWSTR)0x0);
}

Assistant:

Var DataView::EntryGetFloat32(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        BOOL isLittleEndian = FALSE;

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0 || !VarIs<DataView>(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedDataView);
        }
        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DataView_NeedArgument, _u("offset"));
        }
        if (args.Info.Count > 2)
        {
            isLittleEndian = JavascriptConversion::ToBoolean(args[2], scriptContext);
        }

        DataView* dataView = VarTo<DataView>(args[0]);
        return dataView->GetValueWithCheck<float>(args[1], _u("DataView.prototype.GetFloat32"), isLittleEndian);
    }